

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr toPath_00;
  int fromDirFd;
  bool bVar1;
  size_t sVar2;
  String *pSVar3;
  char *pcVar4;
  char *pcVar5;
  PathPtr PVar6;
  StringPtr toPath_01;
  PathPtr toPath_02;
  StringPtr fromPath_01;
  int error;
  PathPtr toPath_local;
  Fault f;
  size_t local_68;
  Array<char> local_58;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_40;
  
  sVar2 = toPath.parts.size_;
  pSVar3 = toPath.parts.ptr;
  toPath_local.parts.ptr = pSVar3;
  toPath_local.parts.size_ = sVar2;
  if (sVar2 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x586,FAILED,"toPath.size() > 0","\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::~Fault(&f);
    return false;
  }
  if (mode == MOVE) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&f,fromDirectory);
    fromDirFd = f.exception._4_4_;
    if ((char)f.exception != '\0') {
      error = 0;
      PathPtr::toString((String *)&f,&toPath_local,false);
      pcVar5 = (char *)CONCAT44(f.exception._4_4_,f.exception._0_4_);
      PathPtr::toString((String *)&local_58,&fromPath,false);
      toPath_01.content.size_ = local_68 + (local_68 == 0);
      pcVar4 = "";
      if (local_68 == 0) {
        pcVar5 = "";
      }
      if (local_58.size_ != 0) {
        pcVar4 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      }
      fromPath_01.content.size_ = local_58.size_ + (local_58.size_ == 0);
      toPath_01.content.ptr = pcVar5;
      fromPath_01.content.ptr = pcVar4;
      bVar1 = tryCommitReplacement(this,toPath_01,fromDirFd,fromPath_01,toMode,&error);
      Array<char>::~Array(&local_58);
      Array<char>::~Array((Array<char> *)&f);
      if (bVar1) {
        return true;
      }
      if (error != 0) {
        sVar2 = toPath_local.parts.size_;
        pSVar3 = toPath_local.parts.ptr;
        if (error == 0x12) goto LAB_004c53c6;
        if (error == 2) {
          if ((~toMode & 5) != 0) {
            return false;
          }
          if (toPath_local.parts.size_ == 0) {
            return false;
          }
          PVar6 = PathPtr::parent(&toPath_local);
          bVar1 = tryMkdir(this,PVar6,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar1) {
            toPath_00.parts.size_ = toPath_local.parts.size_;
            toPath_00.parts.ptr = toPath_local.parts.ptr;
            PVar6.parts.size_ = fromPath.parts.size_;
            PVar6.parts.ptr = fromPath.parts.ptr;
            bVar1 = tryTransfer(this,toPath_00,toMode & ~CREATE_PARENT,fromDirectory,PVar6,MOVE,self
                               );
            return bVar1;
          }
        }
        else {
          kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x5ad,error,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                     &toPath_local);
          kj::_::Debug::Fault::~Fault(&f);
        }
      }
      return false;
    }
  }
  else if (mode == LINK) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_58,fromDirectory);
    f.exception._0_1_ = (char)local_58.ptr;
    if ((char)local_58.ptr != '\0') {
      f.exception._4_4_ = local_58.ptr._4_4_;
      local_40.ptr = (Iface *)operator_new(0x20);
      (local_40.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0067eb18;
      local_40.ptr[1]._vptr_Iface = (_func_int **)&f;
      local_40.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
      local_40.ptr[3]._vptr_Iface = (_func_int **)this;
      local_40.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      bVar1 = tryReplaceNode(this,toPath,toMode,(Function<int_(kj::StringPtr)> *)&local_40);
      Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_40);
      return bVar1;
    }
  }
LAB_004c53c6:
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  toPath_02.parts.size_ = sVar2;
  toPath_02.parts.ptr = pSVar3;
  bVar1 = Directory::tryTransfer(self,toPath_02,toMode,fromDirectory,fromPath_00,mode);
  return bVar1;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(*fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), *fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }